

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void sysbvm_analysisQueue_enqueueProgramEntity
               (sysbvm_context_t *context,sysbvm_tuple_t queue,sysbvm_tuple_t programEntity)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *psVar2;
  
  if (queue == 0 || (queue & 0xf) != 0) {
    sysbvm_error("Expected a valid analysis queue.");
  }
  sVar1 = sysbvm_analysisQueueEntry_create(context,programEntity);
  psVar2 = (sysbvm_tuple_t *)(*(long *)(queue + 0x18) + 0x18);
  if (*(long *)(queue + 0x18) == 0) {
    psVar2 = (sysbvm_tuple_t *)(queue + 0x10);
  }
  *psVar2 = sVar1;
  *(sysbvm_tuple_t *)(queue + 0x18) = sVar1;
  return;
}

Assistant:

SYSBVM_API void sysbvm_analysisQueue_enqueueProgramEntity(sysbvm_context_t *context, sysbvm_tuple_t queue, sysbvm_tuple_t programEntity)
{
    if(!sysbvm_tuple_isNonNullPointer(queue))
        sysbvm_error("Expected a valid analysis queue.");

    sysbvm_analysisQueue_t *queueObject = (sysbvm_analysisQueue_t*)queue;
    sysbvm_tuple_t newEntry = sysbvm_analysisQueueEntry_create(context, programEntity);
    if(queueObject->lastEntry)
        ((sysbvm_analysisQueueEntry_t*)queueObject->lastEntry)->nextEntry = newEntry;
    else
        queueObject->firstEntry = newEntry;
    queueObject->lastEntry = newEntry;
}